

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void check_lcps(uchar *latest,uchar *from0,lcp_t lcp0,uchar *from1,lcp_t lcp1)

{
  uchar uVar1;
  lcp_t lVar2;
  uchar uVar3;
  
  uVar1 = *latest;
  if (uVar1 == '\0') {
    if (lcp0 != 0) goto LAB_001d2eaa;
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    uVar3 = uVar1;
    do {
      if (uVar3 != from0[lVar2]) break;
      uVar3 = latest[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (uVar3 != '\0');
    if (lVar2 != lcp0) {
LAB_001d2eaa:
      __assert_fail("lcp(latest, from0) == lcp0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x629,
                    "void check_lcps(unsigned char *, unsigned char *, lcp_t, unsigned char *, lcp_t)"
                   );
    }
    lVar2 = 0;
    do {
      if (uVar1 != from1[lVar2]) break;
      uVar1 = latest[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (uVar1 != '\0');
  }
  if (lVar2 != lcp1) {
    __assert_fail("lcp(latest, from1) == lcp1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x62a,
                  "void check_lcps(unsigned char *, unsigned char *, lcp_t, unsigned char *, lcp_t)"
                 );
  }
  return;
}

Assistant:

static void
check_lcps(unsigned char* latest,
           unsigned char* from0, lcp_t lcp0,
           unsigned char* from1, lcp_t lcp1)
{
	debug()<<"******** CHECK ********\n"
	       <<"Latest: '"<<latest<<"'\n"
	       <<"     0: '"<<from0<<"', lcp="<<lcp0<<"\n"
	       <<"     1: '"<<from1<<"', lcp="<<lcp1<<"\n"
	       <<"***********************\n";
	assert(lcp(latest, from0) == lcp0);
	assert(lcp(latest, from1) == lcp1);
}